

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O2

bool __thiscall QString::endsWith(QString *this,QChar c,CaseSensitivity cs)

{
  long lVar1;
  char16_t cVar2;
  char16_t cVar3;
  bool bVar4;
  
  lVar1 = (this->d).size;
  if (lVar1 != 0) {
    cVar2 = (this->d).ptr[lVar1 + -1];
    if (cs == CaseSensitive) {
      bVar4 = cVar2 == c.ucs;
    }
    else {
      cVar2 = foldCase(cVar2);
      cVar3 = foldCase(c.ucs);
      bVar4 = cVar2 == cVar3;
    }
    return bVar4;
  }
  return false;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }